

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-bind.c
# Opt level: O3

int run_test_udp_bind(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  char *handle;
  sockaddr_in addr;
  uv_udp_t h2;
  uv_udp_t h1;
  sockaddr_in sStack_390;
  undefined1 auStack_380 [216];
  undefined1 auStack_2a8 [240];
  uv_udp_t local_1b8;
  uv_udp_t local_e0;
  
  auStack_2a8._216_8_ = (void *)0x1842a0;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)(auStack_2a8 + 0xe0));
  if (iVar1 == 0) {
    auStack_2a8._216_8_ = (void *)0x1842ad;
    unaff_RBX = uv_default_loop();
    auStack_2a8._216_8_ = (void *)0x1842c0;
    iVar1 = uv_udp_init(unaff_RBX,&local_e0);
    if (iVar1 != 0) goto LAB_00184381;
    auStack_2a8._216_8_ = (void *)0x1842d5;
    iVar1 = uv_udp_init(unaff_RBX,&local_1b8);
    if (iVar1 != 0) goto LAB_00184386;
    auStack_2a8._216_8_ = (void *)0x1842ef;
    iVar1 = uv_udp_bind(&local_e0,(sockaddr *)(auStack_2a8 + 0xe0),0);
    if (iVar1 != 0) goto LAB_0018438b;
    auStack_2a8._216_8_ = (void *)0x184306;
    iVar1 = uv_udp_bind(&local_1b8,(sockaddr *)(auStack_2a8 + 0xe0),0);
    if (iVar1 != -0x62) goto LAB_00184390;
    auStack_2a8._216_8_ = (void *)0x18431e;
    uv_close((uv_handle_t *)&local_e0,(uv_close_cb)0x0);
    auStack_2a8._216_8_ = (void *)0x18432a;
    uv_close((uv_handle_t *)&local_1b8,(uv_close_cb)0x0);
    auStack_2a8._216_8_ = (void *)0x184334;
    iVar1 = uv_run(unaff_RBX,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00184395;
    auStack_2a8._216_8_ = (void *)0x18433d;
    unaff_RBX = uv_default_loop();
    auStack_2a8._216_8_ = (void *)0x184351;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    auStack_2a8._216_8_ = (void *)0x18435b;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    auStack_2a8._216_8_ = (void *)0x184360;
    puVar2 = uv_default_loop();
    auStack_2a8._216_8_ = (void *)0x184368;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      auStack_2a8._216_8_ = (void *)0x184371;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_2a8._216_8_ = (void *)0x184381;
    run_test_udp_bind_cold_1();
LAB_00184381:
    auStack_2a8._216_8_ = (void *)0x184386;
    run_test_udp_bind_cold_2();
LAB_00184386:
    auStack_2a8._216_8_ = (void *)0x18438b;
    run_test_udp_bind_cold_3();
LAB_0018438b:
    auStack_2a8._216_8_ = (void *)0x184390;
    run_test_udp_bind_cold_4();
LAB_00184390:
    auStack_2a8._216_8_ = (void *)0x184395;
    run_test_udp_bind_cold_5();
LAB_00184395:
    auStack_2a8._216_8_ = (void *)0x18439a;
    run_test_udp_bind_cold_6();
  }
  auStack_2a8._216_8_ = run_test_udp_bind_reuseaddr;
  run_test_udp_bind_cold_7();
  handle = "0.0.0.0";
  auStack_2a8._216_8_ = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_390);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    handle = (char *)puVar2;
    iVar1 = uv_udp_init(puVar2,(uv_udp_t *)auStack_2a8);
    if (iVar1 != 0) goto LAB_001844a1;
    handle = (char *)puVar2;
    iVar1 = uv_udp_init(puVar2,(uv_udp_t *)auStack_380);
    if (iVar1 != 0) goto LAB_001844a6;
    handle = auStack_2a8;
    iVar1 = uv_udp_bind((uv_udp_t *)handle,(sockaddr *)&sStack_390,4);
    if (iVar1 != 0) goto LAB_001844ab;
    handle = auStack_380;
    iVar1 = uv_udp_bind((uv_udp_t *)handle,(sockaddr *)&sStack_390,4);
    if (iVar1 != 0) goto LAB_001844b0;
    uv_close((uv_handle_t *)auStack_2a8,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)auStack_380,(uv_close_cb)0x0);
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001844ba;
    }
  }
  else {
    run_test_udp_bind_reuseaddr_cold_1();
LAB_001844a1:
    run_test_udp_bind_reuseaddr_cold_2();
LAB_001844a6:
    run_test_udp_bind_reuseaddr_cold_3();
LAB_001844ab:
    run_test_udp_bind_reuseaddr_cold_4();
LAB_001844b0:
    puVar2 = (uv_loop_t *)handle;
    run_test_udp_bind_reuseaddr_cold_5();
  }
  run_test_udp_bind_reuseaddr_cold_6();
LAB_001844ba:
  run_test_udp_bind_reuseaddr_cold_7();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(udp_bind) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  uv_udp_t h1, h2;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h1);
  ASSERT(r == 0);

  r = uv_udp_init(loop, &h2);
  ASSERT(r == 0);

  r = uv_udp_bind(&h1, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_bind(&h2, (const struct sockaddr*) &addr, 0);
  ASSERT(r == UV_EADDRINUSE);

  uv_close((uv_handle_t*) &h1, NULL);
  uv_close((uv_handle_t*) &h2, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}